

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

void __thiscall QFont::setHintingPreference(QFont *this,HintingPreference hintingPreference)

{
  byte *pbVar1;
  QFontPrivate *pQVar2;
  
  if (((this->resolve_mask & 0x8000) == 0) ||
     (*(uint *)&(((this->d).d.ptr)->request).field_0x60 >> 0x1e != hintingPreference)) {
    detach(this);
    pQVar2 = (this->d).d.ptr;
    *(ulong *)&(pQVar2->request).field_0x60 =
         *(ulong *)&(pQVar2->request).field_0x60 & 0xffffffff3fffffff |
         (ulong)(hintingPreference << 0x1e);
    pbVar1 = (byte *)((long)&this->resolve_mask + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  return;
}

Assistant:

void QFont::setHintingPreference(HintingPreference hintingPreference)
{
    if ((resolve_mask & QFont::HintingPreferenceResolved) && d->request.hintingPreference == hintingPreference)
        return;

    detach();

    d->request.hintingPreference = hintingPreference;

    resolve_mask |= QFont::HintingPreferenceResolved;
}